

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lockstep_scheduler.cpp
# Opt level: O1

int __thiscall LockstepScheduler::usleep_until(LockstepScheduler *this,uint64_t time_us)

{
  int iVar1;
  int *piVar2;
  pthread_mutex_t lock;
  pthread_cond_t cond;
  pthread_mutex_t pStack_78;
  pthread_cond_t local_50;
  
  pthread_mutex_init((pthread_mutex_t *)&pStack_78,(pthread_mutexattr_t *)0x0);
  pthread_cond_init(&local_50,(pthread_condattr_t *)0x0);
  pthread_mutex_lock((pthread_mutex_t *)&pStack_78);
  iVar1 = cond_timedwait(this,(pthread_cond_t *)&local_50,&pStack_78,time_us);
  if (iVar1 == -1) {
    piVar2 = __errno_location();
    iVar1 = -1;
    if (*piVar2 == 0x6e) {
      *piVar2 = 0;
      iVar1 = 0;
    }
  }
  pthread_mutex_unlock((pthread_mutex_t *)&pStack_78);
  pthread_cond_destroy(&local_50);
  pthread_mutex_destroy((pthread_mutex_t *)&pStack_78);
  return iVar1;
}

Assistant:

int LockstepScheduler::usleep_until(uint64_t time_us)
{
    pthread_mutex_t lock;
    pthread_mutex_init(&lock, NULL);
    pthread_cond_t cond;
    pthread_cond_init(&cond, NULL);

    pthread_mutex_lock(&lock);

    int result = cond_timedwait(&cond, &lock, time_us);

    if (result == -1 && errno == ETIMEDOUT) {
        // This is expected because we never notified to the condition.
        errno = 0;
        result = 0;
    }

    pthread_mutex_unlock(&lock);

    pthread_cond_destroy(&cond);
    pthread_mutex_destroy(&lock);

    return result;
}